

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

void __thiscall
Lodtalk::StackInterpreter::callNativeMethod
          (StackInterpreter *this,NativeMethod *nativeMethod,size_t argumentCount)

{
  int iVar1;
  StackMemory *pSVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  long *plVar5;
  long lVar6;
  Oop selector;
  StackInterpreterProxy proxy;
  
  pSVar2 = this->stack;
  puVar3 = (pSVar2->stackFrame).stackPointer;
  uVar4 = *(undefined8 *)(puVar3 + argumentCount * 8 + 8);
  (pSVar2->stackFrame).stackPointer = puVar3 + -8;
  *(uint8_t **)(puVar3 + -8) = (pSVar2->stackFrame).framePointer;
  pSVar2 = this->stack;
  puVar3 = (pSVar2->stackFrame).stackPointer;
  (pSVar2->stackFrame).framePointer = puVar3;
  (pSVar2->stackFrame).stackPointer = puVar3 + -8;
  *(NativeMethod **)(puVar3 + -8) = nativeMethod;
  this->method = (CompiledMethod *)0x0;
  pSVar2 = this->stack;
  puVar3 = (pSVar2->stackFrame).stackPointer;
  *(size_t *)(puVar3 + -8) = argumentCount & 0xff;
  (pSVar2->stackFrame).stackPointer = puVar3 + -0x10;
  *(undefined8 **)(puVar3 + -0x10) = &NilObject;
  puVar3 = (this->stack->stackFrame).stackPointer;
  (this->stack->stackFrame).stackPointer = puVar3 + -8;
  *(undefined8 *)(puVar3 + -8) = uVar4;
  puVar3 = (this->stack->stackFrame).stackPointer;
  (this->stack->stackFrame).stackPointer = puVar3 + -8;
  *(NativeMethod **)(puVar3 + -8) = nativeMethod;
  VMContext::garbageCollectionSafePoint(this->context);
  plVar5 = (long *)(this->stack->stackFrame).stackPointer;
  lVar6 = *plVar5;
  (this->stack->stackFrame).stackPointer = (uint8_t *)(plVar5 + 1);
  fetchFrameData(this);
  this->pc = 0;
  this->primitiveHasFailed = false;
  checkStackOverflow(this);
  (**(code **)(lVar6 + 8))();
  if (this->primitiveHasFailed == true) {
    this->pc = 0;
    pSVar2 = this->stack;
    puVar3 = (pSVar2->stackFrame).stackPointer;
    uVar4 = *(undefined8 *)((pSVar2->stackFrame).framePointer + -0x20);
    (pSVar2->stackFrame).stackPointer = puVar3 + -8;
    *(undefined8 *)(puVar3 + -8) = uVar4;
    iVar1 = this->primitiveErrorCode;
    puVar3 = (this->stack->stackFrame).stackPointer;
    (this->stack->stackFrame).stackPointer = puVar3 + -8;
    *(long *)(puVar3 + -8) = (long)iVar1 * 2 + 1;
    selector = VMContext::getSpecialMessageSelector(this->context,NativeMethodFailed);
    sendSelectorArgumentCount(this,selector,1,false);
  }
  return;
}

Assistant:

void StackInterpreter::callNativeMethod(NativeMethod *nativeMethod, size_t argumentCount)
{
    // Get the receiver
	auto receiver = stackOopAtOffset((1 + argumentCount)*sizeof(Oop));

	// Push the frame pointer.
	pushPointer(stack->getFramePointer()); // Return frame pointer.

	// Set the new frame pointer.
	stack->setFramePointer(stack->getStackPointer());

	// Push the method object.
	pushOop(Oop::fromPointer(nativeMethod));
	this->method = nullptr;

	// Encode frame metadata
	pushUInt(encodeFrameMetaData(false, false, argumentCount));

	// Push the nil this context.
	pushOop(Oop());

	// Push the receiver oop.
	pushOop(receiver);

    // Safe point for GC.
    pushOop(Oop::fromPointer(nativeMethod));
    garbageCollectionSafePoint();
    nativeMethod = reinterpret_cast<NativeMethod*> (popOop().pointer);

	// Fetch the frame data.
	fetchFrameData();

    // Set the new pc.
    pc = 0;

    // Reset the primitive has failed flag.
    primitiveHasFailed = 0;

    // Check for stack overflow.
    checkStackOverflow();

    // Call the primitive
    StackInterpreterProxy proxy(this);
    nativeMethod->primitive(&proxy);

    // Check for failure of the primtiive.
    if(primitiveHasFailed)
    {
        pc = 0;
        pushOop(currentReceiver());
        pushOop(Oop::encodeSmallInteger(primitiveErrorCode));
        sendSpecialArgumentCount(SpecialMessageSelector::NativeMethodFailed, 1);
    }
}